

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::FeatureDescription::ByteSizeLong(FeatureDescription *this)

{
  string *psVar1;
  size_t sVar2;
  size_t sVar3;
  
  psVar1 = (this->name_).ptr_;
  if (psVar1->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar2 = sVar2 + 1;
  }
  psVar1 = (this->shortdescription_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->type_ != (FeatureType *)0x0 &&
      this != (FeatureDescription *)&_FeatureDescription_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureType>(this->type_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t FeatureDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureDescription)
  size_t total_size = 0;

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  // string shortDescription = 2;
  if (this->shortdescription().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->shortdescription());
  }

  // .CoreML.Specification.FeatureType type = 3;
  if (this->has_type()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->type_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}